

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall HEkk::computeSimplexLpDualInfeasible(HEkk *this)

{
  HighsInt *pHVar1;
  double dVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  HighsInt iVar;
  long lVar6;
  double dVar7;
  double dVar8;
  
  dVar2 = (this->options_->super_HighsOptionsStruct).dual_feasibility_tolerance;
  (this->analysis_).num_dual_phase_1_lp_dual_infeasibility = 0;
  (this->analysis_).max_dual_phase_1_lp_dual_infeasibility = 0.0;
  (this->analysis_).sum_dual_phase_1_lp_dual_infeasibility = 0.0;
  if (0 < (this->lp_).num_col_) {
    lVar6 = 0;
    do {
      if ((this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar6] != '\0') {
        dVar8 = (this->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        dVar7 = (this->lp_).col_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        bVar3 = highs_isInfinity((this->lp_).col_upper_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar6]);
        bVar4 = highs_isInfinity(-dVar7);
        if (bVar3) {
          if (bVar4) {
            dVar8 = ABS(dVar8);
          }
          else {
            dVar8 = -dVar8;
          }
        }
        else if (!bVar4) {
          dVar8 = 0.0;
        }
        if (0.0 < dVar8) {
          if (dVar2 <= dVar8) {
            pHVar1 = &(this->analysis_).num_dual_phase_1_lp_dual_infeasibility;
            *pHVar1 = *pHVar1 + 1;
          }
          dVar7 = (this->analysis_).max_dual_phase_1_lp_dual_infeasibility;
          if (dVar7 <= dVar8) {
            dVar7 = dVar8;
          }
          (this->analysis_).max_dual_phase_1_lp_dual_infeasibility = dVar7;
          (this->analysis_).sum_dual_phase_1_lp_dual_infeasibility =
               dVar8 + (this->analysis_).sum_dual_phase_1_lp_dual_infeasibility;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->lp_).num_col_);
  }
  if (0 < (this->lp_).num_row_) {
    lVar6 = 0;
    do {
      lVar5 = (long)(this->lp_).num_col_;
      if ((this->basis_).nonbasicFlag_.super__Vector_base<signed_char,_std::allocator<signed_char>_>
          ._M_impl.super__Vector_impl_data._M_start[lVar6 + lVar5] != '\0') {
        dVar8 = (this->info_).workDual_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar5 + lVar6];
        dVar7 = (this->lp_).row_lower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar6];
        bVar3 = highs_isInfinity((this->lp_).row_upper_.
                                 super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar6]);
        if (bVar3) {
          bVar3 = highs_isInfinity(-dVar7);
          if (bVar3) {
            dVar8 = ABS(dVar8);
          }
        }
        else {
          bVar3 = highs_isInfinity(-dVar7);
          if (bVar3) {
            dVar8 = -dVar8;
          }
          else {
            dVar8 = 0.0;
          }
        }
        if (0.0 < dVar8) {
          if (dVar2 <= dVar8) {
            pHVar1 = &(this->analysis_).num_dual_phase_1_lp_dual_infeasibility;
            *pHVar1 = *pHVar1 + 1;
          }
          dVar7 = (this->analysis_).max_dual_phase_1_lp_dual_infeasibility;
          if (dVar7 <= dVar8) {
            dVar7 = dVar8;
          }
          (this->analysis_).max_dual_phase_1_lp_dual_infeasibility = dVar7;
          (this->analysis_).sum_dual_phase_1_lp_dual_infeasibility =
               dVar8 + (this->analysis_).sum_dual_phase_1_lp_dual_infeasibility;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->lp_).num_row_);
  }
  return;
}

Assistant:

void HEkk::computeSimplexLpDualInfeasible() {
  // Compute num/max/sum of dual infeasibilities according to the
  // bounds of the simplex LP. Assumes that boxed variables have
  // primal variable at the bound corresponding to the sign of the
  // dual so should only be used in dual phase 1 - where it's only
  // used for reporting after rebuilds.
  const double scaled_dual_feasibility_tolerance =
      options_->dual_feasibility_tolerance;
  HighsInt& num_dual_infeasibility =
      analysis_.num_dual_phase_1_lp_dual_infeasibility;
  double& max_dual_infeasibility =
      analysis_.max_dual_phase_1_lp_dual_infeasibility;
  double& sum_dual_infeasibility =
      analysis_.sum_dual_phase_1_lp_dual_infeasibility;
  num_dual_infeasibility = 0;
  max_dual_infeasibility = 0;
  sum_dual_infeasibility = 0;

  for (HighsInt iCol = 0; iCol < lp_.num_col_; iCol++) {
    HighsInt iVar = iCol;
    if (!basis_.nonbasicFlag_[iVar]) continue;
    // Nonbasic column
    const double dual = info_.workDual_[iVar];
    const double lower = lp_.col_lower_[iCol];
    const double upper = lp_.col_upper_[iCol];
    double dual_infeasibility = 0;
    if (highs_isInfinity(upper)) {
      if (highs_isInfinity(-lower)) {
        // Free: any nonzero dual value is infeasible
        dual_infeasibility = fabs(dual);
      } else {
        // Only lower bounded: a negative dual is infeasible
        dual_infeasibility = -dual;
      }
    } else {
      if (highs_isInfinity(-lower)) {
        // Only upper bounded: a positive dual is infeasible
        dual_infeasibility = dual;
      } else {
        // Boxed or fixed: any dual value is feasible
        dual_infeasibility = 0;
      }
    }
    if (dual_infeasibility > 0) {
      if (dual_infeasibility >= scaled_dual_feasibility_tolerance)
        num_dual_infeasibility++;
      max_dual_infeasibility =
          std::max(dual_infeasibility, max_dual_infeasibility);
      sum_dual_infeasibility += dual_infeasibility;
    }
  }
  for (HighsInt iRow = 0; iRow < lp_.num_row_; iRow++) {
    HighsInt iVar = lp_.num_col_ + iRow;
    if (!basis_.nonbasicFlag_[iVar]) continue;
    // Nonbasic row
    const double dual = -info_.workDual_[iVar];
    const double lower = lp_.row_lower_[iRow];
    const double upper = lp_.row_upper_[iRow];
    double dual_infeasibility = 0;
    if (highs_isInfinity(upper)) {
      if (highs_isInfinity(-lower)) {
        // Free: any nonzero dual value is infeasible
        dual_infeasibility = fabs(dual);
      } else {
        // Only lower bounded: a negative dual is infeasible
        dual_infeasibility = -dual;
      }
    } else {
      if (highs_isInfinity(-lower)) {
        // Only upper bounded: a positive dual is infeasible
        dual_infeasibility = dual;
      } else {
        // Boxed or fixed: any dual value is feasible
        dual_infeasibility = 0;
      }
    }
    if (dual_infeasibility > 0) {
      if (dual_infeasibility >= scaled_dual_feasibility_tolerance)
        num_dual_infeasibility++;
      max_dual_infeasibility =
          std::max(dual_infeasibility, max_dual_infeasibility);
      sum_dual_infeasibility += dual_infeasibility;
    }
  }
}